

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

void PrecomputeFilterStrengths(VP8Decoder *dec)

{
  uint8_t uVar1;
  VP8FInfo *pVVar2;
  int local_38;
  int local_34;
  int ilevel;
  int level;
  VP8FInfo *info;
  int base_level;
  int i4x4;
  VP8FilterHeader *hdr;
  int s;
  VP8Decoder *dec_local;
  
  if (0 < dec->filter_type) {
    for (s = 0; s < 4; s = s + 1) {
      if ((dec->segment_hdr).use_segment == 0) {
        base_level = (dec->filter_hdr).level;
      }
      else {
        base_level = (int)(dec->segment_hdr).filter_strength[s];
        if ((dec->segment_hdr).absolute_delta == 0) {
          base_level = (dec->filter_hdr).level + base_level;
        }
      }
      for (i4x4 = 0; i4x4 < 2; i4x4 = i4x4 + 1) {
        pVVar2 = dec->fstrengths[s] + i4x4;
        level = base_level;
        if (((dec->filter_hdr).use_lf_delta != 0) &&
           (level = (dec->filter_hdr).ref_lf_delta[0] + base_level, i4x4 != 0)) {
          level = (dec->filter_hdr).mode_lf_delta[0] + level;
        }
        if (level < 0) {
          local_34 = 0;
        }
        else {
          if (level < 0x40) {
            local_38 = level;
          }
          else {
            local_38 = 0x3f;
          }
          local_34 = local_38;
        }
        if (local_34 < 1) {
          pVVar2->f_limit = '\0';
        }
        else {
          ilevel = local_34;
          if (0 < (dec->filter_hdr).sharpness) {
            if ((dec->filter_hdr).sharpness < 5) {
              ilevel = local_34 >> 1;
            }
            else {
              ilevel = local_34 >> 2;
            }
            if (9 - (dec->filter_hdr).sharpness < ilevel) {
              ilevel = 9 - (dec->filter_hdr).sharpness;
            }
          }
          if (ilevel < 1) {
            ilevel = 1;
          }
          pVVar2->f_ilevel = (uint8_t)ilevel;
          pVVar2->f_limit = (char)(local_34 << 1) + (uint8_t)ilevel;
          if (local_34 < 0x28) {
            uVar1 = 0xe < local_34;
          }
          else {
            uVar1 = '\x02';
          }
          pVVar2->hev_thresh = uVar1;
        }
        pVVar2->f_inner = (uint8_t)i4x4;
      }
    }
  }
  return;
}

Assistant:

static void PrecomputeFilterStrengths(VP8Decoder* const dec) {
  if (dec->filter_type > 0) {
    int s;
    const VP8FilterHeader* const hdr = &dec->filter_hdr;
    for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
      int i4x4;
      // First, compute the initial level
      int base_level;
      if (dec->segment_hdr.use_segment) {
        base_level = dec->segment_hdr.filter_strength[s];
        if (!dec->segment_hdr.absolute_delta) {
          base_level += hdr->level;
        }
      } else {
        base_level = hdr->level;
      }
      for (i4x4 = 0; i4x4 <= 1; ++i4x4) {
        VP8FInfo* const info = &dec->fstrengths[s][i4x4];
        int level = base_level;
        if (hdr->use_lf_delta) {
          level += hdr->ref_lf_delta[0];
          if (i4x4) {
            level += hdr->mode_lf_delta[0];
          }
        }
        level = (level < 0) ? 0 : (level > 63) ? 63 : level;
        if (level > 0) {
          int ilevel = level;
          if (hdr->sharpness > 0) {
            if (hdr->sharpness > 4) {
              ilevel >>= 2;
            } else {
              ilevel >>= 1;
            }
            if (ilevel > 9 - hdr->sharpness) {
              ilevel = 9 - hdr->sharpness;
            }
          }
          if (ilevel < 1) ilevel = 1;
          info->f_ilevel = ilevel;
          info->f_limit = 2 * level + ilevel;
          info->hev_thresh = (level >= 40) ? 2 : (level >= 15) ? 1 : 0;
        } else {
          info->f_limit = 0;  // no filtering
        }
        info->f_inner = i4x4;
      }
    }
  }
}